

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O0

kStatus __thiscall
gnilk::Log::Warning<char_const*,char_const*>(Log *this,char *arguments,char *arguments_1)

{
  bool bVar1;
  int iVar2;
  char **in_RCX;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  char *arguments_local_1;
  char *arguments_local;
  Log *this_local;
  
  if (((this->isEnabled & 1U) != 0) &&
     (str.field_2._8_8_ = arguments_1, arguments_local_1 = arguments, arguments_local = (char *)this
     , bVar1 = WithinRange(this,kWarning), bVar1)) {
    ::fmt::v10::sprintf<char_const*,char_const*,char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
               (v10 *)&arguments_local_1,(char **)((long)&str.field_2 + 8),in_RCX);
    iVar2 = SendLogMessage(this,kWarning,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_48);
    this_local._4_4_ = kSendError;
    if (0 < iVar2) {
      this_local._4_4_ = kOk;
    }
    std::__cxx11::string::~string((string *)local_48);
    return this_local._4_4_;
  }
  return kFiltered;
}

Assistant:

inline kStatus Warning(T... arguments) const {
            if (!(isEnabled && WithinRange(kWarning))) return kStatus::kFiltered;
            auto str = fmt::sprintf(arguments...);
            return (SendLogMessage(kWarning, str) > 0) ? kStatus::kOk : kStatus::kSendError;
        }